

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

int Gia_ManCorrSpecReal(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int f,int nPrefix)

{
  uint __line;
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Gia_Obj_t *pObj_00;
  char *__assertion;
  
  uVar4 = *(ulong *)pObj & 0x1fffffff;
  if (uVar4 != 0x1fffffff && -1 < (int)*(ulong *)pObj) {
    Gia_ManCorrSpecReduce_rec(pNew,p,pObj + -uVar4,f,nPrefix);
    Gia_ManCorrSpecReduce_rec
              (pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),f,nPrefix);
    iVar1 = Gia_ObjFanin0CopyF(p,f,pObj);
    iVar3 = Gia_ObjCopyF(p,f,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar3 = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar3);
    return iVar1;
  }
  iVar1 = Gia_ObjIsRo(p,pObj);
  if (f == 0) {
    if (iVar1 != 0) {
      iVar1 = Gia_ObjCopyF(p,0,pObj);
      return iVar1;
    }
    __assertion = "Gia_ObjIsRo(p, pObj)";
    __line = 0x39;
  }
  else {
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsRo(p,pObj);
      if (iVar1 != 0) {
        iVar1 = p->vCos->nSize;
        iVar3 = p->vCis->nSize;
        iVar2 = Gia_ObjCioId(pObj);
        pObj_00 = Gia_ManCo(p,(iVar1 - iVar3) + iVar2);
        Gia_ManCorrSpecReduce_rec
                  (pNew,p,pObj_00 + -(ulong)((uint)*(undefined8 *)pObj_00 & 0x1fffffff),f + -1,
                   nPrefix);
        iVar1 = Gia_ObjFanin0CopyF(p,f + -1,pObj_00);
        return iVar1;
      }
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
    }
    __assertion = "f && Gia_ObjIsRo(p, pObj)";
    __line = 0x3c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                ,__line,"int Gia_ManCorrSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)");
}

Assistant:

static inline int Gia_ManCorrSpecReal( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int f, int nPrefix )
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), f, nPrefix );
        Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin1(pObj), f, nPrefix );
        return Gia_ManHashAnd( pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj) );
    }
    if ( f == 0 )
    {
        assert( Gia_ObjIsRo(p, pObj) );
        return Gia_ObjCopyF(p, f, pObj);
    }
    assert( f && Gia_ObjIsRo(p, pObj) );
    pObj = Gia_ObjRoToRi( p, pObj );
    Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), f-1, nPrefix );
    return Gia_ObjFanin0CopyF( p, f-1, pObj );
}